

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

void __thiscall
Corrade::Utility::Arguments::Entry::Entry
          (Entry *this,Type type,char shortKey,string *key,string *helpKey,string *defaultValue,
          size_t id)

{
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *defaultValue_local;
  string *helpKey_local;
  string *key_local;
  char shortKey_local;
  Entry *pEStack_10;
  Type type_local;
  Entry *this_local;
  
  this->type = type;
  this->shortKey = shortKey;
  local_30 = defaultValue;
  defaultValue_local = helpKey;
  helpKey_local = key;
  key_local._6_1_ = shortKey;
  key_local._7_1_ = type;
  pEStack_10 = this;
  std::__cxx11::string::string((string *)&this->key,(string *)key);
  std::__cxx11::string::string((string *)&this->help);
  std::__cxx11::string::string((string *)&this->helpKey);
  std::__cxx11::string::string((string *)&this->defaultValue,(string *)defaultValue);
  std::__cxx11::string::string((string *)&this->environment);
  this->id = id;
  if (((key_local._7_1_ == NamedArgument) || (key_local._7_1_ == Option)) ||
     (key_local._7_1_ == ArrayOption)) {
    std::operator+(&local_70,&this->key,' ');
    std::__cxx11::string::string((string *)&local_c0,(string *)helpKey);
    anon_unknown_3::uppercaseKey(&local_a0,&local_c0);
    std::operator+(&local_50,&local_70,&local_a0);
    std::__cxx11::string::operator=((string *)&this->helpKey,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->helpKey,(string *)helpKey);
  }
  return;
}

Assistant:

Arguments::Entry::Entry(Type type, char shortKey, std::string key, std::string helpKey, std::string defaultValue, std::size_t id): type(type), shortKey(shortKey), key(std::move(key)), defaultValue(std::move(defaultValue)), id(id) {
    if(type == Type::NamedArgument || type == Type::Option || type == Type::ArrayOption)
        this->helpKey = this->key + ' ' + uppercaseKey(helpKey);
    else this->helpKey = std::move(helpKey);
}